

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_filter.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::DynamicFilter::Copy(DynamicFilter *this)

{
  _func_int **in_RAX;
  long in_RSI;
  _func_int **local_18;
  
  local_18 = in_RAX;
  make_uniq<duckdb::DynamicFilter,duckdb::shared_ptr<duckdb::DynamicFilterData,true>const&>
            ((duckdb *)&local_18,(shared_ptr<duckdb::DynamicFilterData,_true> *)(in_RSI + 0x10));
  (this->super_TableFilter)._vptr_TableFilter = local_18;
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> DynamicFilter::Copy() const {
	return make_uniq<DynamicFilter>(filter_data);
}